

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O0

double __thiscall HighsPseudocost::getScore(HighsPseudocost *this,HighsInt col,double frac)

{
  HighsInt in_ESI;
  HighsPseudocost *in_RDI;
  HighsPseudocost *in_XMM0_Qa;
  double dVar1;
  double downcost;
  double upcost;
  double in_stack_00000198;
  double in_stack_000001a0;
  HighsInt in_stack_000001ac;
  HighsPseudocost *in_stack_000001b0;
  double in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  
  getPseudocostUp(in_XMM0_Qa,(HighsInt)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                  in_stack_ffffffffffffffd8);
  getPseudocostDown(in_RDI,in_ESI,(double)in_XMM0_Qa);
  dVar1 = getScore(in_stack_000001b0,in_stack_000001ac,in_stack_000001a0,in_stack_00000198);
  return dVar1;
}

Assistant:

double getScore(HighsInt col, double frac) const {
    double upcost = getPseudocostUp(col, frac);
    double downcost = getPseudocostDown(col, frac);

    return getScore(col, upcost, downcost);
  }